

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int default_emit_certificate_cb
              (ptls_emit_certificate_t *_self,ptls_t *tls,ptls_message_emitter_t *emitter,
              ptls_key_schedule_t *key_sched,ptls_iovec_t context,int push_status_request,
              uint16_t *compress_algos,size_t num_compress_algos)

{
  long lVar1;
  ptls_buffer_t *buf;
  ptls_iovec_t *certificates;
  size_t num_certificates;
  ptls_iovec_t context_00;
  ulong uVar2;
  ptls_iovec_t ocsp_status;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t local_60;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  ptls_key_schedule_t *ppStack_38;
  int ret;
  ptls_key_schedule_t *key_sched_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_emit_certificate_t *_self_local;
  ptls_iovec_t context_local;
  
  context_local.base = (uint8_t *)context.len;
  _self_local = (ptls_emit_certificate_t *)context.base;
  _buf = (ptls_buffer_t *)emitter;
  ppStack_38 = key_sched;
  key_sched_local = (ptls_key_schedule_t *)emitter;
  emitter_local = (ptls_message_emitter_t *)tls;
  tls_local = (ptls_t *)_self;
  _emitter._4_4_ = (*emitter->begin_message)(emitter);
  if (_emitter._4_4_ == 0) {
    _key_sched = (ptls_key_schedule_t *)_buf->base;
    mess_start = (size_t)ppStack_38;
    local_60 = *(size_t *)(_key_sched->secret + 0xc);
    capacity._7_1_ = 0xb;
    _emitter._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
    if (_emitter._4_4_ == 0) {
      body_start = 3;
      _emitter._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
      if (_emitter._4_4_ == 0) {
        lVar1 = *(long *)(_key_sched->secret + 0xc);
        buf = *(ptls_buffer_t **)key_sched_local;
        certificates = (ptls_iovec_t *)emitter_local->buf[1].base;
        num_certificates = emitter_local->buf[1].capacity;
        ocsp_status = ptls_iovec_init((void *)0x0,0);
        context_00.len = (size_t)context_local.base;
        context_00.base = (uint8_t *)_self_local;
        _emitter._4_4_ =
             ptls_build_certificate_message
                       (buf,context_00,certificates,num_certificates,ocsp_status);
        if (_emitter._4_4_ == 0) {
          uVar2 = *(long *)(_key_sched->secret + 0xc) - lVar1;
          if (uVar2 < 0x1000000) {
            for (; body_start != 0; body_start = body_start - 1) {
              *(char *)(*(long *)_key_sched + (lVar1 - body_start)) =
                   (char)(uVar2 >> (((char)body_start + -1) * '\b' & 0x3fU));
            }
            if (mess_start != 0) {
              ptls__key_schedule_update_hash
                        ((ptls_key_schedule_t *)mess_start,
                         (uint8_t *)(*(long *)_key_sched + local_60),
                         *(long *)(_key_sched->secret + 0xc) - local_60,0);
            }
            _emitter._4_4_ = (*(code *)_buf[1].base)(_buf);
            if (_emitter._4_4_ == 0) {
              _emitter._4_4_ = 0;
            }
          }
          else {
            _emitter._4_4_ = 0x20c;
          }
        }
      }
    }
  }
  return _emitter._4_4_;
}

Assistant:

static int default_emit_certificate_cb(ptls_emit_certificate_t *_self, ptls_t *tls, ptls_message_emitter_t *emitter,
                                       ptls_key_schedule_t *key_sched, ptls_iovec_t context, int push_status_request,
                                       const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    ptls_push_message(emitter, key_sched, PTLS_HANDSHAKE_TYPE_CERTIFICATE, {
        if ((ret = ptls_build_certificate_message(emitter->buf, context, tls->ctx->certificates.list, tls->ctx->certificates.count,
                                                  ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    });

    ret = 0;
Exit:
    return ret;
}